

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_png.cpp
# Opt level: O3

void __thiscall PNGHandle::~PNGHandle(PNGHandle *this)

{
  char *pcVar1;
  uint uVar2;
  ulong uVar3;
  
  uVar2 = (this->TextChunks).Count;
  if (uVar2 != 0) {
    uVar3 = 0;
    do {
      pcVar1 = (this->TextChunks).Array[uVar3];
      if (pcVar1 != (char *)0x0) {
        operator_delete__(pcVar1);
        uVar2 = (this->TextChunks).Count;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < uVar2);
  }
  if ((this->bDeleteFilePtr != false) && (this->File != (FileReader *)0x0)) {
    (*(this->File->super_FileReaderBase)._vptr_FileReaderBase[1])();
  }
  TArray<char_*,_char_*>::~TArray(&this->TextChunks);
  TArray<PNGHandle::Chunk,_PNGHandle::Chunk>::~TArray(&this->Chunks);
  return;
}

Assistant:

PNGHandle::~PNGHandle ()
{
	for (unsigned int i = 0; i < TextChunks.Size(); ++i)
	{
		delete[] TextChunks[i];
	}
	if (bDeleteFilePtr)
	{
		delete File;
	}
}